

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyOfferPdu.cpp
# Opt level: O1

bool __thiscall DIS::ResupplyOfferPdu::operator==(ResupplyOfferPdu *this,ResupplyOfferPdu *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  pointer pSVar4;
  long lVar5;
  ulong uVar6;
  
  bVar1 = LogisticsFamilyPdu::operator==
                    (&this->super_LogisticsFamilyPdu,&rhs->super_LogisticsFamilyPdu);
  bVar2 = EntityID::operator==(&this->_receivingEntityID,&rhs->_receivingEntityID);
  bVar3 = EntityID::operator==(&this->_supplyingEntityID,&rhs->_supplyingEntityID);
  bVar1 = this->_padding2 == rhs->_padding2 &&
          (this->_padding1 == rhs->_padding1 && (bVar3 && (bVar2 && bVar1)));
  pSVar4 = (this->_supplies).
           super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_supplies).
      super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar4) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar2 = SupplyQuantity::operator==
                        ((SupplyQuantity *)((long)&pSVar4->_vptr_SupplyQuantity + lVar5),
                         (SupplyQuantity *)
                         ((long)&((rhs->_supplies).
                                  super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_SupplyQuantity +
                         lVar5));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar6 = uVar6 + 1;
      pSVar4 = (this->_supplies).
               super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl
               .super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 < (ulong)((long)(this->_supplies).
                                   super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 5));
  }
  return bVar1;
}

Assistant:

bool ResupplyOfferPdu::operator ==(const ResupplyOfferPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = LogisticsFamilyPdu::operator==(rhs);

     if( ! (_receivingEntityID == rhs._receivingEntityID) ) ivarsEqual = false;
     if( ! (_supplyingEntityID == rhs._supplyingEntityID) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _supplies.size(); idx++)
     {
        if( ! ( _supplies[idx] == rhs._supplies[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }